

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_sse_single(uint16_t *data,uint32_t len,uint32_t *flags)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  int iVar52;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  int i_2;
  int j;
  int i_1;
  int k;
  int i;
  uint32_t pos;
  uint32_t n_update_cycles;
  uint32_t n_cycles;
  __m128i *data_vectors;
  uint32_t out_counters [16];
  __m128i masksHi;
  __m128i masksLo;
  __m128i one_mask;
  __m128i counterHi;
  __m128i counterLo;
  int local_c70;
  int local_c6c;
  uint local_c68;
  int local_c64;
  uint local_c60;
  uint local_c5c;
  int local_c48 [16];
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined1 local_bd8 [16];
  undefined1 local_bc8 [16];
  long local_bb0;
  uint local_ba4;
  long local_ba0;
  undefined2 local_b6e;
  undefined2 local_b6c;
  undefined2 local_b6a;
  undefined1 local_b68 [16];
  undefined2 local_b58;
  undefined2 local_b56;
  undefined2 local_b54;
  undefined2 local_b52;
  undefined2 local_b50;
  undefined2 local_b4e;
  undefined2 local_b4c;
  undefined2 local_b4a;
  undefined1 local_b48 [16];
  undefined2 local_b38;
  undefined2 local_b36;
  undefined2 local_b34;
  undefined2 local_b32;
  undefined2 local_b30;
  undefined2 local_b2e;
  undefined2 local_b2c;
  undefined2 local_b2a;
  undefined1 local_b28 [16];
  undefined2 local_b18;
  undefined2 local_b16;
  undefined2 local_b14;
  undefined2 local_b12;
  undefined2 local_b10;
  undefined2 local_b0e;
  undefined2 local_b0c;
  undefined2 local_b0a;
  undefined1 local_8c8 [16];
  undefined2 local_8b8;
  undefined2 local_8b6;
  undefined2 local_8b4;
  undefined2 local_8b2;
  undefined2 local_8b0;
  undefined2 local_8ae;
  undefined2 local_8ac;
  undefined2 local_8aa;
  undefined1 local_8a8 [16];
  undefined2 local_898;
  undefined2 local_896;
  undefined2 local_894;
  undefined2 local_892;
  undefined2 local_890;
  undefined2 local_88e;
  undefined2 local_88c;
  undefined2 local_88a;
  
  local_b6a = 0;
  local_b4a = 0;
  local_b4c = 0;
  local_b4e = 0;
  local_b50 = 0;
  local_b52 = 0;
  local_b54 = 0;
  local_b56 = 0;
  local_b58 = 0;
  auVar2 = vpinsrw_avx(ZEXT216(0),0,1);
  auVar2 = vpinsrw_avx(auVar2,0,2);
  auVar2 = vpinsrw_avx(auVar2,0,3);
  auVar2 = vpinsrw_avx(auVar2,0,4);
  auVar2 = vpinsrw_avx(auVar2,0,5);
  auVar2 = vpinsrw_avx(auVar2,0,6);
  local_bc8 = vpinsrw_avx(auVar2,0,7);
  local_b6c = 0;
  local_b2a = 0;
  local_b2c = 0;
  local_b2e = 0;
  local_b30 = 0;
  local_b32 = 0;
  local_b34 = 0;
  local_b36 = 0;
  local_b38 = 0;
  auVar2 = vpinsrw_avx(ZEXT216(0),0,1);
  auVar2 = vpinsrw_avx(auVar2,0,2);
  auVar2 = vpinsrw_avx(auVar2,0,3);
  auVar2 = vpinsrw_avx(auVar2,0,4);
  auVar2 = vpinsrw_avx(auVar2,0,5);
  auVar2 = vpinsrw_avx(auVar2,0,6);
  local_bd8 = vpinsrw_avx(auVar2,0,7);
  local_b6e = 1;
  local_b0a = 1;
  local_b0c = 1;
  local_b0e = 1;
  local_b10 = 1;
  local_b12 = 1;
  local_b14 = 1;
  local_b16 = 1;
  local_b18 = 1;
  auVar2 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar2 = vpinsrw_avx(auVar2,1,2);
  auVar2 = vpinsrw_avx(auVar2,1,3);
  auVar2 = vpinsrw_avx(auVar2,1,4);
  auVar2 = vpinsrw_avx(auVar2,1,5);
  auVar2 = vpinsrw_avx(auVar2,1,6);
  local_b28 = vpinsrw_avx(auVar2,1,7);
  local_be8 = local_b28._0_8_;
  uStack_be0 = local_b28._8_8_;
  local_88a = 0x8000;
  local_88c = 0x4000;
  local_88e = 0x2000;
  local_890 = 0x1000;
  local_892 = 0x800;
  local_894 = 0x400;
  local_896 = 0x200;
  local_898 = 0x100;
  auVar2 = vpinsrw_avx(ZEXT216(0x100),0x200,1);
  auVar2 = vpinsrw_avx(auVar2,0x400,2);
  auVar2 = vpinsrw_avx(auVar2,0x800,3);
  auVar2 = vpinsrw_avx(auVar2,0x1000,4);
  auVar2 = vpinsrw_avx(auVar2,0x2000,5);
  auVar2 = vpinsrw_avx(auVar2,0x4000,6);
  local_8a8 = vpinsrw_avx(auVar2,0x8000,7);
  local_bf8 = local_8a8._0_8_;
  uStack_bf0 = local_8a8._8_8_;
  local_8aa = 0x80;
  local_8ac = 0x40;
  local_8ae = 0x20;
  local_8b0 = 0x10;
  local_8b2 = 8;
  local_8b4 = 4;
  local_8b6 = 2;
  local_8b8 = 1;
  auVar2 = vpinsrw_avx(ZEXT216(1),2,1);
  auVar2 = vpinsrw_avx(auVar2,4,2);
  auVar2 = vpinsrw_avx(auVar2,8,3);
  auVar2 = vpinsrw_avx(auVar2,0x10,4);
  auVar2 = vpinsrw_avx(auVar2,0x20,5);
  auVar2 = vpinsrw_avx(auVar2,0x40,6);
  local_8c8 = vpinsrw_avx(auVar2,0x80,7);
  local_c08 = local_8c8._0_8_;
  uStack_c00 = local_8c8._8_8_;
  local_bb0 = in_RDX;
  local_ba4 = in_ESI;
  local_ba0 = in_RDI;
  local_b68 = local_bc8;
  local_b48 = local_bd8;
  memset(local_c48,0,0x40);
  local_c5c = 0;
  for (local_c60 = 0; local_c60 < local_ba4 >> 0xf; local_c60 = local_c60 + 1) {
    for (local_c64 = 0; local_c64 < 0x1000; local_c64 = local_c64 + 1) {
      uVar1 = *(ushort *)(local_ba0 + (ulong)local_c5c * 0x10);
      auVar2 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,2);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,3);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,4);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,5);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,6);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,7);
      auVar35._8_8_ = uStack_bf0;
      auVar35._0_8_ = local_bf8;
      auVar2 = vpand_avx(auVar2,auVar35);
      auVar51._8_8_ = uStack_bf0;
      auVar51._0_8_ = local_bf8;
      auVar2 = vpcmpeqw_avx(auVar2,auVar51);
      auVar34._8_8_ = uStack_be0;
      auVar34._0_8_ = local_be8;
      auVar2 = vpand_avx(auVar2,auVar34);
      auVar2 = vpaddw_avx(local_bc8,auVar2);
      uVar1 = *(ushort *)(local_ba0 + (ulong)local_c5c * 0x10 + 2);
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      auVar33._8_8_ = uStack_bf0;
      auVar33._0_8_ = local_bf8;
      auVar3 = vpand_avx(auVar3,auVar33);
      auVar50._8_8_ = uStack_bf0;
      auVar50._0_8_ = local_bf8;
      auVar3 = vpcmpeqw_avx(auVar3,auVar50);
      auVar32._8_8_ = uStack_be0;
      auVar32._0_8_ = local_be8;
      auVar3 = vpand_avx(auVar3,auVar32);
      auVar2 = vpaddw_avx(auVar2,auVar3);
      uVar1 = *(ushort *)(local_ba0 + (ulong)local_c5c * 0x10 + 4);
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      auVar31._8_8_ = uStack_bf0;
      auVar31._0_8_ = local_bf8;
      auVar3 = vpand_avx(auVar3,auVar31);
      auVar49._8_8_ = uStack_bf0;
      auVar49._0_8_ = local_bf8;
      auVar3 = vpcmpeqw_avx(auVar3,auVar49);
      auVar30._8_8_ = uStack_be0;
      auVar30._0_8_ = local_be8;
      auVar3 = vpand_avx(auVar3,auVar30);
      auVar2 = vpaddw_avx(auVar2,auVar3);
      uVar1 = *(ushort *)(local_ba0 + (ulong)local_c5c * 0x10 + 6);
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      auVar29._8_8_ = uStack_bf0;
      auVar29._0_8_ = local_bf8;
      auVar3 = vpand_avx(auVar3,auVar29);
      auVar48._8_8_ = uStack_bf0;
      auVar48._0_8_ = local_bf8;
      auVar3 = vpcmpeqw_avx(auVar3,auVar48);
      auVar28._8_8_ = uStack_be0;
      auVar28._0_8_ = local_be8;
      auVar3 = vpand_avx(auVar3,auVar28);
      auVar2 = vpaddw_avx(auVar2,auVar3);
      uVar1 = *(ushort *)(local_ba0 + (ulong)local_c5c * 0x10 + 8);
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      auVar27._8_8_ = uStack_bf0;
      auVar27._0_8_ = local_bf8;
      auVar3 = vpand_avx(auVar3,auVar27);
      auVar47._8_8_ = uStack_bf0;
      auVar47._0_8_ = local_bf8;
      auVar3 = vpcmpeqw_avx(auVar3,auVar47);
      auVar26._8_8_ = uStack_be0;
      auVar26._0_8_ = local_be8;
      auVar3 = vpand_avx(auVar3,auVar26);
      auVar2 = vpaddw_avx(auVar2,auVar3);
      uVar1 = *(ushort *)(local_ba0 + (ulong)local_c5c * 0x10 + 10);
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      auVar25._8_8_ = uStack_bf0;
      auVar25._0_8_ = local_bf8;
      auVar3 = vpand_avx(auVar3,auVar25);
      auVar46._8_8_ = uStack_bf0;
      auVar46._0_8_ = local_bf8;
      auVar3 = vpcmpeqw_avx(auVar3,auVar46);
      auVar24._8_8_ = uStack_be0;
      auVar24._0_8_ = local_be8;
      auVar3 = vpand_avx(auVar3,auVar24);
      auVar2 = vpaddw_avx(auVar2,auVar3);
      uVar1 = *(ushort *)(local_ba0 + (ulong)local_c5c * 0x10 + 0xc);
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      auVar23._8_8_ = uStack_bf0;
      auVar23._0_8_ = local_bf8;
      auVar3 = vpand_avx(auVar3,auVar23);
      auVar45._8_8_ = uStack_bf0;
      auVar45._0_8_ = local_bf8;
      auVar3 = vpcmpeqw_avx(auVar3,auVar45);
      auVar22._8_8_ = uStack_be0;
      auVar22._0_8_ = local_be8;
      auVar3 = vpand_avx(auVar3,auVar22);
      auVar2 = vpaddw_avx(auVar2,auVar3);
      uVar1 = *(ushort *)(local_ba0 + (ulong)local_c5c * 0x10 + 0xe);
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      auVar21._8_8_ = uStack_bf0;
      auVar21._0_8_ = local_bf8;
      auVar3 = vpand_avx(auVar3,auVar21);
      auVar44._8_8_ = uStack_bf0;
      auVar44._0_8_ = local_bf8;
      auVar3 = vpcmpeqw_avx(auVar3,auVar44);
      auVar20._8_8_ = uStack_be0;
      auVar20._0_8_ = local_be8;
      auVar3 = vpand_avx(auVar3,auVar20);
      local_bc8 = vpaddw_avx(auVar2,auVar3);
      uVar1 = *(ushort *)(local_ba0 + (ulong)local_c5c * 0x10);
      auVar2 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,2);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,3);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,4);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,5);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,6);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar1,7);
      auVar19._8_8_ = uStack_c00;
      auVar19._0_8_ = local_c08;
      auVar2 = vpand_avx(auVar2,auVar19);
      auVar43._8_8_ = uStack_c00;
      auVar43._0_8_ = local_c08;
      auVar2 = vpcmpeqw_avx(auVar2,auVar43);
      auVar3._8_8_ = uStack_be0;
      auVar3._0_8_ = local_be8;
      auVar2 = vpand_avx(auVar2,auVar3);
      auVar2 = vpaddw_avx(local_bd8,auVar2);
      uVar1 = *(ushort *)(local_ba0 + (ulong)local_c5c * 0x10 + 2);
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      auVar18._8_8_ = uStack_c00;
      auVar18._0_8_ = local_c08;
      auVar3 = vpand_avx(auVar3,auVar18);
      auVar42._8_8_ = uStack_c00;
      auVar42._0_8_ = local_c08;
      auVar3 = vpcmpeqw_avx(auVar3,auVar42);
      auVar17._8_8_ = uStack_be0;
      auVar17._0_8_ = local_be8;
      auVar3 = vpand_avx(auVar3,auVar17);
      auVar2 = vpaddw_avx(auVar2,auVar3);
      uVar1 = *(ushort *)(local_ba0 + (ulong)local_c5c * 0x10 + 4);
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      auVar16._8_8_ = uStack_c00;
      auVar16._0_8_ = local_c08;
      auVar3 = vpand_avx(auVar3,auVar16);
      auVar41._8_8_ = uStack_c00;
      auVar41._0_8_ = local_c08;
      auVar3 = vpcmpeqw_avx(auVar3,auVar41);
      auVar15._8_8_ = uStack_be0;
      auVar15._0_8_ = local_be8;
      auVar3 = vpand_avx(auVar3,auVar15);
      auVar2 = vpaddw_avx(auVar2,auVar3);
      uVar1 = *(ushort *)(local_ba0 + (ulong)local_c5c * 0x10 + 6);
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      auVar14._8_8_ = uStack_c00;
      auVar14._0_8_ = local_c08;
      auVar3 = vpand_avx(auVar3,auVar14);
      auVar40._8_8_ = uStack_c00;
      auVar40._0_8_ = local_c08;
      auVar3 = vpcmpeqw_avx(auVar3,auVar40);
      auVar13._8_8_ = uStack_be0;
      auVar13._0_8_ = local_be8;
      auVar3 = vpand_avx(auVar3,auVar13);
      auVar2 = vpaddw_avx(auVar2,auVar3);
      uVar1 = *(ushort *)(local_ba0 + (ulong)local_c5c * 0x10 + 8);
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      auVar12._8_8_ = uStack_c00;
      auVar12._0_8_ = local_c08;
      auVar3 = vpand_avx(auVar3,auVar12);
      auVar39._8_8_ = uStack_c00;
      auVar39._0_8_ = local_c08;
      auVar3 = vpcmpeqw_avx(auVar3,auVar39);
      auVar11._8_8_ = uStack_be0;
      auVar11._0_8_ = local_be8;
      auVar3 = vpand_avx(auVar3,auVar11);
      auVar2 = vpaddw_avx(auVar2,auVar3);
      uVar1 = *(ushort *)(local_ba0 + (ulong)local_c5c * 0x10 + 10);
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      auVar10._8_8_ = uStack_c00;
      auVar10._0_8_ = local_c08;
      auVar3 = vpand_avx(auVar3,auVar10);
      auVar38._8_8_ = uStack_c00;
      auVar38._0_8_ = local_c08;
      auVar3 = vpcmpeqw_avx(auVar3,auVar38);
      auVar9._8_8_ = uStack_be0;
      auVar9._0_8_ = local_be8;
      auVar3 = vpand_avx(auVar3,auVar9);
      auVar2 = vpaddw_avx(auVar2,auVar3);
      uVar1 = *(ushort *)(local_ba0 + (ulong)local_c5c * 0x10 + 0xc);
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      auVar8._8_8_ = uStack_c00;
      auVar8._0_8_ = local_c08;
      auVar3 = vpand_avx(auVar3,auVar8);
      auVar37._8_8_ = uStack_c00;
      auVar37._0_8_ = local_c08;
      auVar3 = vpcmpeqw_avx(auVar3,auVar37);
      auVar7._8_8_ = uStack_be0;
      auVar7._0_8_ = local_be8;
      auVar3 = vpand_avx(auVar3,auVar7);
      auVar2 = vpaddw_avx(auVar2,auVar3);
      uVar1 = *(ushort *)(local_ba0 + (ulong)local_c5c * 0x10 + 0xe);
      auVar3 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar1,7);
      auVar6._8_8_ = uStack_c00;
      auVar6._0_8_ = local_c08;
      auVar3 = vpand_avx(auVar3,auVar6);
      auVar36._8_8_ = uStack_c00;
      auVar36._0_8_ = local_c08;
      uVar4 = vpcmpeqw_avx512vl(auVar3,auVar36);
      auVar3 = vpmovm2w_avx512vl(uVar4);
      auVar5._8_8_ = uStack_be0;
      auVar5._0_8_ = local_be8;
      auVar3 = vpand_avx(auVar3,auVar5);
      local_bd8 = vpaddw_avx(auVar2,auVar3);
      local_c5c = local_c5c + 1;
    }
    iVar52 = vpextrw_avx(local_bd8,0);
    local_c48[0] = local_c48[0] + iVar52;
    iVar52 = vpextrw_avx(local_bd8,1);
    local_c48[1] = local_c48[1] + iVar52;
    iVar52 = vpextrw_avx(local_bd8,2);
    local_c48[2] = local_c48[2] + iVar52;
    iVar52 = vpextrw_avx(local_bd8,3);
    local_c48[3] = local_c48[3] + iVar52;
    iVar52 = vpextrw_avx(local_bd8,4);
    local_c48[4] = local_c48[4] + iVar52;
    iVar52 = vpextrw_avx(local_bd8,5);
    local_c48[5] = local_c48[5] + iVar52;
    iVar52 = vpextrw_avx(local_bd8,6);
    local_c48[6] = local_c48[6] + iVar52;
    iVar52 = vpextrw_avx(local_bd8,7);
    local_c48[7] = local_c48[7] + iVar52;
    iVar52 = vpextrw_avx(local_bc8,0);
    local_c48[8] = local_c48[8] + iVar52;
    iVar52 = vpextrw_avx(local_bc8,1);
    local_c48[9] = local_c48[9] + iVar52;
    iVar52 = vpextrw_avx(local_bc8,2);
    local_c48[10] = local_c48[10] + iVar52;
    iVar52 = vpextrw_avx(local_bc8,3);
    local_c48[0xb] = local_c48[0xb] + iVar52;
    iVar52 = vpextrw_avx(local_bc8,4);
    local_c48[0xc] = local_c48[0xc] + iVar52;
    iVar52 = vpextrw_avx(local_bc8,5);
    local_c48[0xd] = local_c48[0xd] + iVar52;
    iVar52 = vpextrw_avx(local_bc8,6);
    local_c48[0xe] = local_c48[0xe] + iVar52;
    iVar52 = vpextrw_avx(local_bc8,7);
    local_c48[0xf] = local_c48[0xf] + iVar52;
    auVar2 = vpinsrw_avx(ZEXT216(0),0,1);
    auVar2 = vpinsrw_avx(auVar2,0,2);
    auVar2 = vpinsrw_avx(auVar2,0,3);
    auVar2 = vpinsrw_avx(auVar2,0,4);
    auVar2 = vpinsrw_avx(auVar2,0,5);
    auVar2 = vpinsrw_avx(auVar2,0,6);
    local_bc8 = vpinsrw_avx(auVar2,0,7);
    auVar2 = vpinsrw_avx(ZEXT216(0),0,1);
    auVar2 = vpinsrw_avx(auVar2,0,2);
    auVar2 = vpinsrw_avx(auVar2,0,3);
    auVar2 = vpinsrw_avx(auVar2,0,4);
    auVar2 = vpinsrw_avx(auVar2,0,5);
    auVar2 = vpinsrw_avx(auVar2,0,6);
    local_bd8 = vpinsrw_avx(auVar2,0,7);
  }
  for (local_c68 = local_c5c << 3; local_c68 < local_ba4; local_c68 = local_c68 + 1) {
    for (local_c6c = 0; local_c6c < 0x10; local_c6c = local_c6c + 1) {
      local_c48[local_c6c] =
           ((int)((uint)*(ushort *)(local_ba0 + (long)(int)local_c68 * 2) &
                 1 << ((byte)local_c6c & 0x1f)) >> ((byte)local_c6c & 0x1f)) + local_c48[local_c6c];
    }
  }
  for (local_c70 = 0; local_c70 < 0x10; local_c70 = local_c70 + 1) {
    *(int *)(local_bb0 + (long)local_c70 * 4) = local_c48[local_c70];
  }
  return 0;
}

Assistant:

int pospopcnt_u16_sse_single(const uint16_t* data, uint32_t len, uint32_t* flags) {
    __m128i counterLo = _mm_set1_epi16(0);
    __m128i counterHi = _mm_set1_epi16(0);
    const __m128i one_mask =  _mm_set1_epi16(1);
    // set_epi is parameterized backwards (15->0)
    const __m128i masksLo = _mm_set_epi16(-32768, 1 << 14, 1 << 13, 1 << 12,
                                          1 << 11, 1 << 10, 1 << 9,  1 << 8);
    const __m128i masksHi = _mm_set_epi16(1 << 7,  1 << 6,  1 << 5,  1 << 4,
                                          1 << 3,  1 << 2,  1 << 1,  1 << 0);

    uint32_t out_counters[16] = {0};
    const __m128i* data_vectors = (const __m128i*)(data);
    const uint32_t n_cycles = len / 8;
    const uint32_t n_update_cycles = n_cycles / 4096;

#define UPDATE_LO(idx) counterLo = _mm_add_epi16(counterLo, _mm_and_si128(_mm_cmpeq_epi16(_mm_and_si128(_mm_set1_epi16(_mm_extract_epi16(_mm_loadu_si128(data_vectors+pos), idx)), masksLo), masksLo), one_mask));
#define UPDATE_HI(idx) counterHi = _mm_add_epi16(counterHi, _mm_and_si128(_mm_cmpeq_epi16(_mm_and_si128(_mm_set1_epi16(_mm_extract_epi16(_mm_loadu_si128(data_vectors+pos), idx)), masksHi), masksHi), one_mask));
#define BLOCK {                                         \
    UPDATE_LO(0) UPDATE_LO(1) UPDATE_LO(2) UPDATE_LO(3) \
    UPDATE_LO(4) UPDATE_LO(5) UPDATE_LO(6) UPDATE_LO(7) \
    UPDATE_HI(0) UPDATE_HI(1) UPDATE_HI(2) UPDATE_HI(3) \
    UPDATE_HI(4) UPDATE_HI(5) UPDATE_HI(6) UPDATE_HI(7) \
}
#define UH(idx) out_counters[idx] += _mm_extract_epi16(counterLo, idx - 8);
#define UL(idx) out_counters[idx] += _mm_extract_epi16(counterHi, idx);

    uint32_t pos = 0;
    for (int i = 0; i < n_update_cycles; ++i) { // each block of 65536 values
        for (int k = 0; k < 4096; ++k, ++pos) { // max sum of each 16-bit value in a register (65536/16)
            BLOCK
        }

        // Compute vector sum (unroll to prevent possible compiler errors
        // regarding constness of parameter N in _mm_extract_epi16).
        UL(0)  UL(1)  UL(2)  UL(3)
        UL(4)  UL(5)  UL(6)  UL(7)
        UH(8)  UH(9)  UH(10) UH(11)
        UH(12) UH(13) UH(14) UH(15)
        counterLo = _mm_set1_epi16(0);
        counterHi = _mm_set1_epi16(0);
    }

#undef UL
#undef UH
#undef BLOCK
#undef UPDATE_HI
#undef UPDATE_LO

    // residual
    for (int i = pos*8; i < len; ++i) {
        for (int j = 0; j < 16; ++j)
            out_counters[j] += ((data[i] & (1 << j)) >> j);
    }

    for (int i = 0; i < 16; ++i) flags[i] = out_counters[i];

    return 0;
}